

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobCacheEntry.h
# Opt level: O0

void __thiscall
cmGlobCacheEntry::cmGlobCacheEntry
          (cmGlobCacheEntry *this,bool recurse,bool listDirectories,bool followSymlinks,
          string *relative,string *expression,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  string *expression_local;
  string *relative_local;
  bool followSymlinks_local;
  bool listDirectories_local;
  bool recurse_local;
  cmGlobCacheEntry *this_local;
  
  this->Recurse = recurse;
  this->ListDirectories = listDirectories;
  this->FollowSymlinks = followSymlinks;
  std::__cxx11::string::string((string *)&this->Relative,(string *)relative);
  std::__cxx11::string::string((string *)&this->Expression,(string *)expression);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files,files);
  return;
}

Assistant:

cmGlobCacheEntry(bool recurse, bool listDirectories, bool followSymlinks,
                   std::string relative, std::string expression,
                   std::vector<std::string> files)
    : Recurse(recurse)
    , ListDirectories(listDirectories)
    , FollowSymlinks(followSymlinks)
    , Relative(std::move(relative))
    , Expression(std::move(expression))
    , Files(std::move(files))
  {
  }